

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPSources::ProcessRawPacket
          (RTPSources *this,RTPRawPacket *rawpack,RTPTransmitter *rtptrans,bool acceptownpackets)

{
  int iVar1;
  RTPTransmitter *transmitters [1];
  RTPTransmitter *local_8;
  
  local_8 = rtptrans;
  iVar1 = ProcessRawPacket(this,rawpack,&local_8,(uint)(rtptrans != (RTPTransmitter *)0x0),
                           acceptownpackets);
  return iVar1;
}

Assistant:

int RTPSources::ProcessRawPacket(RTPRawPacket *rawpack,RTPTransmitter *rtptrans,bool acceptownpackets)
{
	RTPTransmitter *transmitters[1];
	int num;
	
	transmitters[0] = rtptrans;
	if (rtptrans == 0)
		num = 0;
	else
		num = 1;
	return ProcessRawPacket(rawpack,transmitters,num,acceptownpackets);
}